

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::lookup<tcu::Matrix<float,4,4>>
          (Environment *this,Variable<tcu::Matrix<float,_4,_4>_> *variable)

{
  mapped_type *this_00;
  IVal *pIVar1;
  string local_40;
  deUint8 *data;
  Variable<tcu::Matrix<float,_4,_4>_> *variable_local;
  Environment *this_local;
  
  data = (deUint8 *)variable;
  variable_local = (Variable<tcu::Matrix<float,_4,_4>_> *)this;
  Variable<tcu::Matrix<float,4,4>>::getName_abi_cxx11_(&local_40,variable);
  this_00 = de::
            lookup<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
                      (&this->m_map,&local_40);
  pIVar1 = (IVal *)de::SharedPtr<unsigned_char>::get(this_00);
  std::__cxx11::string::~string((string *)&local_40);
  return pIVar1;
}

Assistant:

typename Traits<T>::IVal&	lookup	(const Variable<T>& variable) const
	{
		deUint8* const data = de::lookup(m_map, variable.getName()).get();

		return *reinterpret_cast<typename Traits<T>::IVal*>(data);
	}